

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O2

StrScanFmt lj_strscan_scan(uint8_t *p,MSize len,TValue *o,uint32_t opt)

{
  StrScanFmt SVar1;
  StrScanFmt SVar2;
  long lVar3;
  ulong uVar4;
  uint64_t uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  byte bVar10;
  byte bVar11;
  ulong uVar12;
  uint uVar13;
  byte *pbVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  byte bVar18;
  uint uVar19;
  byte *pbVar20;
  uint uVar21;
  long lVar22;
  byte bVar23;
  int iVar24;
  byte *pbVar25;
  bool bVar26;
  bool bVar27;
  lua_Number lVar28;
  double dVar29;
  uint local_250;
  byte local_238 [520];
  
  pbVar14 = p + len;
  uVar4 = (ulong)*p;
  bVar26 = false;
  pbVar25 = p;
  if ((""[uVar4 + 1] & 8) == 0) {
    do {
      p = pbVar25;
      bVar11 = *p;
      uVar4 = (ulong)bVar11;
      pbVar25 = p + 1;
    } while ((""[uVar4 + 1] & 2) != 0);
    if ((bVar11 == 0x2b) || (bVar11 == 0x2d)) {
      local_250 = (uint)(bVar11 == 0x2d);
      uVar4 = (ulong)*pbVar25;
      p = pbVar25;
    }
    else {
      local_250 = 0;
    }
    if (0x40 < (byte)uVar4) {
      uVar5 = 0xfff8000000000000;
      bVar11 = (byte)uVar4 & 0xdf;
      pbVar25 = p;
      if (bVar11 == 0x4e) {
        if ((p[1] & 0xdf) == 0x41) {
          pbVar25 = p + (ulong)((p[2] & 0xdf) == 0x4e) * 3;
        }
      }
      else if (((bVar11 == 0x49) && ((p[1] & 0xdf) == 0x4e)) && ((p[2] & 0xdf) == 0x46)) {
        uVar5 = 0xfff0000000000000;
        if (local_250 == 0) {
          uVar5 = 0x7ff0000000000000;
        }
        pbVar20 = p + 3;
        pbVar25 = pbVar20;
        if ((((p[3] & 0xdf) == 0x49) && ((p[4] & 0xdf) == 0x4e)) &&
           (((p[5] & 0xdf) == 0x49 &&
            (((p[6] & 0xdf) == 0x54 && (pbVar25 = p + 8, (p[7] & 0xdf) != 0x59)))))) {
          pbVar25 = pbVar20;
        }
      }
      pbVar25 = pbVar25 + -1;
      do {
        pbVar20 = pbVar25 + 1;
        pbVar25 = pbVar25 + 1;
      } while ((""[(ulong)*pbVar20 + 1] & 2) != 0);
      if (pbVar14 <= pbVar25 && *pbVar20 == 0) {
        o->u64 = uVar5;
        return STRSCAN_NUM;
      }
      return STRSCAN_ERROR;
    }
  }
  else {
    local_250 = 0;
  }
  bVar10 = (byte)uVar4;
  bVar11 = 10;
  if (bVar10 == 0x30) {
    bVar11 = 0;
  }
  if ((opt & 0x10) == 0) {
    bVar11 = 10;
  }
  bVar23 = 8;
  if (bVar10 < 0x31) {
    if (bVar10 == 0x30) {
      if ((p[1] | 0x20) == 0x62) {
        p = p + 2;
        bVar11 = 2;
      }
      else if ((p[1] | 0x20) == 0x78) {
        p = p + 2;
        bVar23 = 0x10;
        bVar11 = bVar23;
      }
    }
    pbVar25 = (byte *)0x0;
    bVar26 = false;
    do {
      bVar10 = *p;
      uVar4 = (ulong)bVar10;
      if (bVar10 == 0x30) {
        bVar26 = true;
      }
      else {
        if (bVar10 != 0x2e) goto LAB_001150db;
        bVar27 = pbVar25 != (byte *)0x0;
        pbVar25 = p;
        if (bVar27) {
          return STRSCAN_ERROR;
        }
      }
      p = p + 1;
    } while( true );
  }
  pbVar25 = (byte *)0x0;
LAB_001150db:
  bVar10 = (byte)uVar4;
  SVar1 = STRSCAN_NUM;
  lVar22 = 0;
  uVar7 = 0;
  uVar21 = 0;
LAB_001150f0:
  bVar18 = (byte)uVar4;
  if ((bVar23 & ""[uVar4 + 1]) != 0) {
    uVar21 = (uint)(bVar18 & 0xf) + uVar21 * 10;
    uVar7 = uVar7 + 1;
LAB_00115110:
    uVar4 = (ulong)p[lVar22 + 1];
    lVar22 = lVar22 + 1;
    goto LAB_001150f0;
  }
  if (bVar18 == 0x2e) {
    if (pbVar25 != (byte *)0x0) {
      return STRSCAN_ERROR;
    }
    pbVar25 = p + lVar22;
    goto LAB_00115110;
  }
  if (!bVar26 && uVar7 == 0) {
    return STRSCAN_ERROR;
  }
  if (pbVar25 == (byte *)0x0) {
    iVar9 = 0;
    SVar1 = STRSCAN_INT;
  }
  else {
    if (bVar11 == 2) {
      return STRSCAN_ERROR;
    }
    if (uVar7 == 0) {
      uVar7 = 0;
      iVar9 = 0;
    }
    else {
      iVar9 = ((int)pbVar25 + (1 - (int)p)) - (int)lVar22;
      iVar24 = iVar9 * 4;
      lVar3 = 0;
      while ((iVar9 < 0 && (p[lVar22 + lVar3 + -1] == 0x30))) {
        iVar9 = iVar9 + 1;
        lVar3 = lVar3 + -1;
        iVar24 = iVar24 + 4;
      }
      if (bVar11 == 0x10) {
        iVar9 = iVar24;
      }
      uVar7 = uVar7 + (int)lVar3;
    }
  }
  pbVar25 = p + lVar22;
  if (9 < bVar11) {
    bVar23 = 0x65;
    if (bVar11 == 0x10) {
      bVar23 = 0x70;
    }
    if (bVar23 == (bVar18 | 0x20)) {
      bVar23 = p[lVar22 + 1];
      if ((bVar23 == 0x2b) || (bVar23 == 0x2d)) {
        pbVar25 = p + lVar22 + 2;
        bVar26 = bVar23 != 0x2d;
        bVar23 = *pbVar25;
      }
      else {
        pbVar25 = p + lVar22 + 1;
        bVar26 = true;
      }
      if ((""[(ulong)bVar23 + 1] & 8) == 0) {
        return STRSCAN_ERROR;
      }
      uVar13 = (uint)(bVar23 & 0xf);
      while( true ) {
        uVar16 = uVar13;
        pbVar25 = pbVar25 + 1;
        bVar18 = *pbVar25;
        if ((""[(ulong)bVar18 + 1] & 8) == 0) break;
        uVar13 = (bVar18 & 0xf) + uVar16 * 10;
        if (0xffff < uVar16) {
          uVar13 = uVar16;
        }
      }
      uVar13 = -uVar16;
      if (bVar26) {
        uVar13 = uVar16;
      }
      iVar9 = uVar13 + iVar9;
      SVar1 = STRSCAN_NUM;
    }
  }
  if (bVar18 != 0) {
    if ((bVar18 | 0x20) == 0x69) {
      if ((opt & 4) == 0) {
        return STRSCAN_ERROR;
      }
      pbVar25 = pbVar25 + 1;
      SVar1 = STRSCAN_IMAG;
    }
    else if (SVar1 == STRSCAN_INT) {
      bVar26 = (bVar18 | 0x20) == 0x75;
      SVar1 = bVar26 + STRSCAN_INT;
      pbVar20 = pbVar25 + bVar26;
      if ((pbVar25[bVar26] & 0xdf) == 0x4c) {
        if ((pbVar20[1] & 0xdf) == 0x4c) {
          pbVar20 = pbVar20 + 2;
        }
        else {
          if ((opt & 0x10) == 0) {
            return STRSCAN_ERROR;
          }
          pbVar20 = pbVar20 + 1;
        }
        SVar1 = bVar26 + STRSCAN_I64;
      }
      if (((*pbVar20 & 0xdf) == 0x55) && ((SVar1 == STRSCAN_I64 || (SVar1 == STRSCAN_INT)))) {
        pbVar20 = pbVar20 + 1;
        SVar1 = SVar1 + STRSCAN_NUM;
      }
      if (((opt & 0x10) == 0) && (SVar1 == STRSCAN_U32)) {
        return STRSCAN_ERROR;
      }
      pbVar25 = pbVar20;
      if (((opt & 8) == 0) && (STRSCAN_U32 < SVar1)) {
        return STRSCAN_ERROR;
      }
    }
    pbVar25 = pbVar25 + -1;
    do {
      pbVar20 = pbVar25 + 1;
      pbVar25 = pbVar25 + 1;
    } while ((""[(ulong)*pbVar20 + 1] & 2) != 0);
    if (*pbVar20 != 0) {
      return STRSCAN_ERROR;
    }
  }
  if (pbVar25 < pbVar14) {
    return STRSCAN_ERROR;
  }
  if (((SVar1 == STRSCAN_INT) && (bVar11 == 10)) &&
     ((uVar7 < 10 || (((uVar7 == 10 && (bVar10 < 0x33)) && (uVar21 < local_250 + 0x80000000)))))) {
    if ((opt & 2) != 0) {
      lVar28 = (lua_Number)uVar21;
      if (local_250 != 0) {
        lVar28 = (lua_Number)((ulong)lVar28 | (ulong)DAT_0015b6f0);
      }
      o->n = lVar28;
      return STRSCAN_NUM;
    }
    uVar7 = -uVar21;
    if (local_250 == 0) {
      uVar7 = uVar21;
    }
    goto LAB_00115ccb;
  }
  if ((bVar11 == 0) && (1 < SVar1 - STRSCAN_NUM)) {
    if (0x16 < uVar7) {
      return STRSCAN_ERROR;
    }
    if ((uVar7 == 0x16) && (0x31 < bVar10)) {
      return STRSCAN_ERROR;
    }
    uVar4 = 0;
    for (lVar22 = 0; uVar7 != (uint)lVar22; lVar22 = lVar22 + 1) {
      if ((p[lVar22] & 0xf8) != 0x30) {
        return STRSCAN_ERROR;
      }
      uVar4 = (ulong)(p[lVar22] & 7) + uVar4 * 8;
    }
    if (SVar1 != STRSCAN_U32) {
      if (SVar1 != STRSCAN_INT) {
        uVar6 = -uVar4;
        if (local_250 == 0) {
          uVar6 = uVar4;
        }
        o->u64 = uVar6;
        return SVar1;
      }
      SVar1 = STRSCAN_U32 - (uVar4 < local_250 + 0x80000000);
    }
    if (uVar4 >> 0x20 != 0) {
      return STRSCAN_ERROR;
    }
    iVar9 = -(int)uVar4;
    if (local_250 == 0) {
      iVar9 = (int)uVar4;
    }
    (o->field_4).i = iVar9;
    return SVar1;
  }
  if (bVar11 == 2) {
    SVar2 = STRSCAN_ERROR;
    if ((uVar7 < 0x41) && (iVar9 == 0)) {
      uVar4 = 0;
      for (lVar22 = 0; uVar7 != (uint)lVar22; lVar22 = lVar22 + 1) {
        if ((p[lVar22] & 0xfffffffe) != 0x30) goto LAB_0011558c;
        uVar4 = (ulong)(p[lVar22] & 1) + uVar4 * 2;
      }
      if (SVar1 - STRSCAN_I64 < 2) goto LAB_001157af;
      if (SVar1 != STRSCAN_U32) {
        if (SVar1 == STRSCAN_INT) {
          if (((opt & 2) == 0) && (uVar4 < local_250 + 0x80000000)) goto LAB_00115795;
          if ((opt & 0x10) != 0) goto LAB_001159a7;
          SVar1 = STRSCAN_NUM;
        }
        bVar26 = uVar4 >> 0x3e != 0;
        uVar6 = (ulong)((uint)uVar4 & 3) | uVar4 >> 2;
        if (!bVar26) {
          uVar6 = uVar4;
        }
        iVar24 = (uint)bVar26 * 2;
        goto LAB_00115c87;
      }
LAB_001159a7:
      if (uVar7 < 0x21) goto LAB_001159b1;
LAB_0011558c:
      SVar2 = STRSCAN_ERROR;
    }
    goto LAB_00115c94;
  }
  if (bVar11 == 0x10) {
    uVar21 = 0x10;
    uVar13 = 0x10;
    if (uVar7 < 0x10) {
      uVar13 = uVar7;
    }
    uVar4 = 0;
    while (bVar26 = uVar13 != 0, uVar13 = uVar13 - 1, bVar26) {
      bVar11 = *p;
      if (bVar11 == 0x2e) {
        bVar11 = p[1];
        p = p + 1;
      }
      uVar16 = bVar11 + 9;
      if (bVar11 < 0x3a) {
        uVar16 = (uint)bVar11;
      }
      uVar4 = uVar4 << 4 | (ulong)(uVar16 & 0xf);
      p = p + 1;
    }
    for (; uVar21 < uVar7; uVar21 = uVar21 + 1) {
      bVar11 = *p;
      if (bVar11 == 0x2e) {
        bVar11 = p[1];
        p = p + 1;
      }
      uVar4 = uVar4 | bVar11 != 0x30;
      iVar9 = iVar9 + 4;
      p = p + 1;
    }
    if (SVar1 - STRSCAN_I64 < 2) {
      if (0x10 < uVar7) goto LAB_0011558c;
LAB_001157af:
      uVar6 = -uVar4;
LAB_00115a5a:
      if (local_250 == 0) {
        uVar6 = uVar4;
      }
      o->u64 = uVar6;
      SVar2 = SVar1;
      goto LAB_00115c94;
    }
    if (SVar1 == STRSCAN_U32) {
LAB_00115491:
      if (8 < uVar7) goto LAB_0011558c;
LAB_001159b1:
      iVar9 = -(int)uVar4;
      if (local_250 == 0) {
        iVar9 = (int)uVar4;
      }
      (o->field_4).i = iVar9;
      SVar2 = STRSCAN_U32;
      goto LAB_00115c94;
    }
    if (SVar1 == STRSCAN_INT) {
      if (((opt & 2) == 0) && (uVar4 < local_250 + 0x80000000)) {
LAB_00115795:
        iVar9 = -(int)uVar4;
        if (local_250 == 0) {
          iVar9 = (int)uVar4;
        }
        (o->field_4).i = iVar9;
        SVar2 = STRSCAN_INT;
        goto LAB_00115c94;
      }
      if ((opt & 0x10) != 0) goto LAB_00115491;
      SVar1 = STRSCAN_NUM;
    }
    uVar6 = (ulong)((uint)uVar4 & 3) | uVar4 >> 2;
    iVar24 = iVar9 + 2;
    if (uVar4 >> 0x3e == 0) {
      uVar6 = uVar4;
      iVar24 = iVar9;
    }
LAB_00115c87:
    strscan_double(uVar6,o,iVar24,local_250);
    SVar2 = SVar1;
  }
  else {
    if (uVar7 == 0) {
      pbVar25 = local_238;
      local_238[0] = 0;
      uVar21 = 0;
      uVar7 = 0;
LAB_001155cb:
      if ((uVar21 != 0) || (0x14 < uVar7)) goto LAB_001157c3;
      pbVar14 = local_238;
      uVar4 = (ulong)local_238[0];
      while (pbVar14 = pbVar14 + 1, pbVar14 < pbVar25) {
        uVar4 = (ulong)*pbVar14 + uVar4 * 100;
      }
      if ((uVar7 == 0x14) && ((uVar21 = 0, 0x12 < local_238[0] || (-1 < (long)uVar4))))
      goto LAB_001157c3;
      if (SVar1 - STRSCAN_I64 < 2) {
        uVar5 = -uVar4;
        if (local_250 == 0) {
          uVar5 = uVar4;
        }
        o->u64 = uVar5;
        SVar2 = SVar1;
        goto LAB_00115c94;
      }
      iVar9 = (int)uVar4;
      if (SVar1 == STRSCAN_U32) {
LAB_00115974:
        if (uVar4 >> 0x20 == 0) {
          iVar24 = -iVar9;
          if (local_250 == 0) {
            iVar24 = iVar9;
          }
          (o->field_4).i = iVar24;
          SVar2 = STRSCAN_U32;
          goto LAB_00115c94;
        }
        goto LAB_00115a26;
      }
      if (SVar1 == STRSCAN_INT) {
        if (((opt & 2) == 0) && (uVar4 < local_250 + 0x80000000)) {
          iVar24 = -iVar9;
          if (local_250 == 0) {
            iVar24 = iVar9;
          }
          (o->field_4).i = iVar24;
          SVar2 = STRSCAN_INT;
          goto LAB_00115c94;
        }
        if ((opt & 0x10) != 0) goto LAB_00115974;
        SVar1 = STRSCAN_NUM;
      }
      if ((long)uVar4 < 0) {
        uVar21 = 0;
        goto LAB_00115a20;
      }
      dVar29 = (double)(long)uVar4;
      if (local_250 != 0) {
        dVar29 = -dVar29;
      }
    }
    else {
      iVar24 = uVar7 - 800;
      if (uVar7 < 800) {
        iVar24 = 0;
      }
      uVar13 = 800;
      if (uVar7 < 800) {
        uVar13 = uVar7;
      }
      uVar21 = iVar9 + iVar24;
      if (((uVar21 ^ uVar13) & 1) == 0) {
        pbVar25 = local_238;
      }
      else {
        if (bVar10 == 0x2e) {
          bVar10 = p[1];
          p = p + 1;
        }
        pbVar25 = local_238 + 1;
        local_238[0] = bVar10 & 0xf;
        uVar13 = uVar13 - 1;
        p = p + 1;
      }
      for (; 1 < uVar13; uVar13 = uVar13 - 2) {
        bVar11 = *p;
        if (bVar11 == 0x2e) {
          bVar11 = p[1];
          p = p + 1;
        }
        bVar10 = p[1];
        lVar22 = 1;
        if (bVar10 == 0x2e) {
          bVar10 = p[2];
          lVar22 = 2;
        }
        *pbVar25 = (bVar10 & 0xf) + (bVar11 & 0xf) * '\n';
        pbVar25 = pbVar25 + 1;
        p = p + lVar22 + 1;
      }
      if (uVar13 != 0) {
        bVar11 = *p;
        if (bVar11 == 0x2e) {
          bVar11 = p[1];
          p = p + 1;
        }
        *pbVar25 = (bVar11 & 0xf) * '\n';
        pbVar25 = pbVar25 + 1;
        uVar21 = uVar21 - 1;
        uVar7 = uVar7 + 1;
        p = p + 1;
      }
      if (uVar7 < 0x321) {
        for (; (0 < (int)uVar21 && (uVar7 < 0x13)); uVar7 = uVar7 + 2) {
          *pbVar25 = 0;
          pbVar25 = pbVar25 + 1;
          uVar21 = uVar21 - 2;
        }
        goto LAB_001155cb;
      }
      do {
        bVar11 = *p;
        if (bVar11 == 0x2e) {
          bVar11 = p[1];
          p = p + 1;
        }
        if (bVar11 != 0x30) {
          pbVar25[-1] = pbVar25[-1] | 1;
          break;
        }
        p = p + 1;
        uVar7 = uVar7 - 1;
      } while (800 < uVar7);
LAB_001157c3:
      iVar9 = (int)pbVar25;
      if (SVar1 == STRSCAN_INT) {
        if ((opt & 0x10) == 0) {
          SVar1 = STRSCAN_NUM;
          goto LAB_00115a2e;
        }
LAB_00115a26:
        SVar2 = STRSCAN_ERROR;
        goto LAB_00115c94;
      }
LAB_00115a20:
      iVar9 = (int)pbVar25;
      if (STRSCAN_INT < SVar1) goto LAB_00115a26;
LAB_00115a2e:
      uVar7 = iVar9 - (int)local_238;
      iVar9 = ((int)uVar21 >> 1) + uVar7;
      if (0x9b < iVar9) {
        uVar4 = 0x7ff0000000000000;
        uVar6 = 0xfff0000000000000;
        goto LAB_00115a5a;
      }
      if (-0xa4 < iVar9) {
        uVar4 = 0;
        iVar8 = 0;
        while ((iVar9 < 9 && (uVar21 = (uint)uVar4, iVar9 < (int)(uVar7 - uVar21 & 0x1ff)))) {
          uVar13 = uVar7 + 0x1ff;
          uVar16 = 0;
          while( true ) {
            uVar13 = uVar13 & 0x1ff;
            uVar19 = (uint)local_238[uVar13] * 0x40 + uVar16;
            uVar16 = uVar19 / 100;
            local_238[uVar13] = (byte)(uVar19 % 100);
            if (uVar13 == uVar21) break;
            if (uVar19 % 100 == 0 && (uVar7 - 1 & 0x1ff) == uVar13) {
              uVar7 = uVar13;
            }
            uVar13 = uVar13 - 1;
          }
          iVar8 = iVar8 + -6;
          if (99 < uVar19) {
            uVar19 = uVar21 - 1 & 0x1ff;
            uVar4 = (ulong)uVar19;
            uVar13 = uVar7 - 1 & 0x1ff;
            uVar21 = uVar13;
            if ((local_238[uVar13] != 0) && (uVar21 = uVar7, uVar19 == uVar7)) {
              local_238[uVar7 + 0x1fe & 0x1ff] =
                   local_238[uVar7 + 0x1fe & 0x1ff] | local_238[uVar13];
              uVar21 = uVar13;
            }
            uVar7 = uVar21;
            local_238[uVar4] = (byte)uVar16;
            iVar9 = iVar9 + 1;
          }
        }
LAB_00115be6:
        if (9 < iVar9) {
          uVar12 = 0;
          uVar6 = uVar4;
          do {
            iVar24 = (int)uVar4;
            uVar21 = (uint)local_238[uVar4] + (int)uVar12;
            local_238[uVar4] = (byte)(uVar21 >> 6);
            uVar12 = (ulong)((uVar21 & 0x3f) * 100);
            iVar17 = (int)uVar6;
            bVar26 = (uVar21 & 0x3fc0) == 0;
            uVar15 = (ulong)(iVar17 + 1U & 0x1ff);
            if (iVar24 != iVar17 || !bVar26) {
              uVar15 = uVar6;
            }
            iVar9 = iVar9 - (uint)(iVar24 == iVar17 && bVar26);
            uVar21 = iVar24 + 1U & 0x1ff;
            uVar4 = (ulong)uVar21;
            uVar6 = uVar15;
          } while (uVar21 != uVar7);
          iVar8 = iVar8 + 6;
          uVar21 = uVar7;
          for (; uVar4 = uVar15, uVar7 = uVar21, (uint)uVar12 != 0;
              uVar12 = (ulong)(((uint)uVar12 & 0x3c) * 100)) {
            uVar7 = (uint)uVar15;
            if (uVar7 == uVar21) {
              local_238[uVar7 - 1 & 0x1ff] = local_238[uVar7 - 1 & 0x1ff] | 1;
              break;
            }
            local_238[uVar21] = (byte)(uVar12 >> 6);
            uVar21 = uVar21 + 1 & 0x1ff;
          }
          goto LAB_00115be6;
        }
        uVar12 = (ulong)local_238[uVar4];
        while( true ) {
          uVar21 = (int)uVar4 + 1U & 0x1ff;
          uVar4 = (ulong)uVar21;
          if ((iVar9 < 2) || (uVar21 == uVar7)) break;
          uVar12 = (ulong)local_238[uVar4] + uVar12 * 100;
          iVar9 = iVar9 + -1;
        }
        if (uVar21 == uVar7) {
          while (iVar9 = iVar9 + -1, uVar6 = uVar12, iVar24 = iVar8, 0 < iVar9) {
            uVar12 = uVar12 * 100;
          }
        }
        else {
          do {
            iVar24 = iVar8 + -1;
            if (local_238[uVar4] != 0) {
              uVar6 = uVar12 * 2 | 1;
              break;
            }
            uVar21 = (int)uVar4 + 1U & 0x1ff;
            uVar4 = (ulong)uVar21;
            uVar6 = uVar12 * 2;
          } while (uVar21 != uVar7);
        }
        goto LAB_00115c87;
      }
      dVar29 = 0.0;
      if (local_250 != 0) {
        dVar29 = -0.0;
      }
    }
    o->u64 = (uint64_t)dVar29;
    SVar2 = SVar1;
  }
LAB_00115c94:
  if ((opt & 1) == 0) {
    return SVar2;
  }
  if (SVar2 != STRSCAN_NUM) {
    return SVar2;
  }
  dVar29 = o->n;
  if (dVar29 != (double)(int)dVar29) {
    return STRSCAN_NUM;
  }
  if (NAN(dVar29) || NAN((double)(int)dVar29)) {
    return STRSCAN_NUM;
  }
  uVar7 = (int)dVar29;
LAB_00115ccb:
  (o->field_4).i = uVar7;
  return STRSCAN_INT;
}

Assistant:

StrScanFmt lj_strscan_scan(const uint8_t *p, MSize len, TValue *o,
			   uint32_t opt)
{
  int32_t neg = 0;
  const uint8_t *pe = p + len;

  /* Remove leading space, parse sign and non-numbers. */
  if (LJ_UNLIKELY(!lj_char_isdigit(*p))) {
    while (lj_char_isspace(*p)) p++;
    if (*p == '+' || *p == '-') neg = (*p++ == '-');
    if (LJ_UNLIKELY(*p >= 'A')) {  /* Parse "inf", "infinity" or "nan". */
      TValue tmp;
      setnanV(&tmp);
      if (casecmp(p[0],'i') && casecmp(p[1],'n') && casecmp(p[2],'f')) {
	if (neg) setminfV(&tmp); else setpinfV(&tmp);
	p += 3;
	if (casecmp(p[0],'i') && casecmp(p[1],'n') && casecmp(p[2],'i') &&
	    casecmp(p[3],'t') && casecmp(p[4],'y')) p += 5;
      } else if (casecmp(p[0],'n') && casecmp(p[1],'a') && casecmp(p[2],'n')) {
	p += 3;
      }
      while (lj_char_isspace(*p)) p++;
      if (*p || p < pe) return STRSCAN_ERROR;
      o->u64 = tmp.u64;
      return STRSCAN_NUM;
    }
  }

  /* Parse regular number. */
  {
    StrScanFmt fmt = STRSCAN_INT;
    int cmask = LJ_CHAR_DIGIT;
    int base = (opt & STRSCAN_OPT_C) && *p == '0' ? 0 : 10;
    const uint8_t *sp, *dp = NULL;
    uint32_t dig = 0, hasdig = 0, x = 0;
    int32_t ex = 0;

    /* Determine base and skip leading zeros. */
    if (LJ_UNLIKELY(*p <= '0')) {
      if (*p == '0') {
	if (casecmp(p[1], 'x'))
	  base = 16, cmask = LJ_CHAR_XDIGIT, p += 2;
	else if (casecmp(p[1], 'b'))
	  base = 2, cmask = LJ_CHAR_DIGIT, p += 2;
      }
      for ( ; ; p++) {
	if (*p == '0') {
	  hasdig = 1;
	} else if (*p == '.') {
	  if (dp) return STRSCAN_ERROR;
	  dp = p;
	} else {
	  break;
	}
      }
    }

    /* Preliminary digit and decimal point scan. */
    for (sp = p; ; p++) {
      if (LJ_LIKELY(lj_char_isa(*p, cmask))) {
	x = x * 10 + (*p & 15);  /* For fast path below. */
	dig++;
      } else if (*p == '.') {
	if (dp) return STRSCAN_ERROR;
	dp = p;
      } else {
	break;
      }
    }
    if (!(hasdig | dig)) return STRSCAN_ERROR;

    /* Handle decimal point. */
    if (dp) {
      if (base == 2) return STRSCAN_ERROR;
      fmt = STRSCAN_NUM;
      if (dig) {
	ex = (int32_t)(dp-(p-1)); dp = p-1;
	while (ex < 0 && *dp-- == '0') ex++, dig--;  /* Skip trailing zeros. */
	if (base == 16) ex *= 4;
      }
    }

    /* Parse exponent. */
    if (base >= 10 && casecmp(*p, (uint32_t)(base == 16 ? 'p' : 'e'))) {
      uint32_t xx;
      int negx = 0;
      fmt = STRSCAN_NUM; p++;
      if (*p == '+' || *p == '-') negx = (*p++ == '-');
      if (!lj_char_isdigit(*p)) return STRSCAN_ERROR;
      xx = (*p++ & 15);
      while (lj_char_isdigit(*p)) {
	if (xx < 65536) xx = xx * 10 + (*p & 15);
	p++;
      }
      ex += negx ? -(int32_t)xx : (int32_t)xx;
    }

    /* Parse suffix. */
    if (*p) {
      /* I (IMAG), U (U32), LL (I64), ULL/LLU (U64), L (long), UL/LU (ulong). */
      /* NYI: f (float). Not needed until cp_number() handles non-integers. */
      if (casecmp(*p, 'i')) {
	if (!(opt & STRSCAN_OPT_IMAG)) return STRSCAN_ERROR;
	p++; fmt = STRSCAN_IMAG;
      } else if (fmt == STRSCAN_INT) {
	if (casecmp(*p, 'u')) p++, fmt = STRSCAN_U32;
	if (casecmp(*p, 'l')) {
	  p++;
	  if (casecmp(*p, 'l')) p++, fmt += STRSCAN_I64 - STRSCAN_INT;
	  else if (!(opt & STRSCAN_OPT_C)) return STRSCAN_ERROR;
	  else if (sizeof(long) == 8) fmt += STRSCAN_I64 - STRSCAN_INT;
	}
	if (casecmp(*p, 'u') && (fmt == STRSCAN_INT || fmt == STRSCAN_I64))
	  p++, fmt += STRSCAN_U32 - STRSCAN_INT;
	if ((fmt == STRSCAN_U32 && !(opt & STRSCAN_OPT_C)) ||
	    (fmt >= STRSCAN_I64 && !(opt & STRSCAN_OPT_LL)))
	  return STRSCAN_ERROR;
      }
      while (lj_char_isspace(*p)) p++;
      if (*p) return STRSCAN_ERROR;
    }
    if (p < pe) return STRSCAN_ERROR;

    /* Fast path for decimal 32 bit integers. */
    if (fmt == STRSCAN_INT && base == 10 &&
	(dig < 10 || (dig == 10 && *sp <= '2' && x < 0x80000000u+neg))) {
      if ((opt & STRSCAN_OPT_TONUM)) {
	o->n = neg ? -(double)x : (double)x;
	return STRSCAN_NUM;
      } else {
	o->i = neg ? -(int32_t)x : (int32_t)x;
	return STRSCAN_INT;
      }
    }

    /* Dispatch to base-specific parser. */
    if (base == 0 && !(fmt == STRSCAN_NUM || fmt == STRSCAN_IMAG))
      return strscan_oct(sp, o, fmt, neg, dig);
    if (base == 16)
      fmt = strscan_hex(sp, o, fmt, opt, ex, neg, dig);
    else if (base == 2)
      fmt = strscan_bin(sp, o, fmt, opt, ex, neg, dig);
    else
      fmt = strscan_dec(sp, o, fmt, opt, ex, neg, dig);

    /* Try to convert number to integer, if requested. */
    if (fmt == STRSCAN_NUM && (opt & STRSCAN_OPT_TOINT)) {
      double n = o->n;
      int32_t i = lj_num2int(n);
      if (n == (lua_Number)i) { o->i = i; return STRSCAN_INT; }
    }
    return fmt;
  }
}